

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O2

bool rsg::AsinOp::transformValueRange(float outMin,float outMax,float *inMin,float *inMax)

{
  float fVar1;
  bool bVar2;
  
  bVar2 = outMin <= 1.5707964 && -1.5707964 <= outMax;
  if (bVar2) {
    if (outMin <= -1.5707964) {
      outMin = -1.5707964;
    }
    fVar1 = sinf(outMin);
    *inMin = fVar1;
    if (1.5707964 <= outMax) {
      outMax = 1.5707964;
    }
    fVar1 = sinf(outMax);
    *inMax = fVar1;
  }
  return bVar2;
}

Assistant:

static inline bool transformValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		const float rangeMin = -DE_PI/2.0f;
		const float rangeMax = +DE_PI/2.0f;

		if (outMax < rangeMin || outMin > rangeMax)
			return false; // Out of range

		inMin = deFloatSin(deFloatMax(outMin, rangeMin));
		inMax = deFloatSin(deFloatMin(outMax, rangeMax));

		return true;
	}